

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setup_common.cpp
# Opt level: O1

CMutableTransaction * __thiscall
TestChain100Setup::CreateValidMempoolTransaction
          (CMutableTransaction *__return_storage_ptr__,TestChain100Setup *this,
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          *input_transactions,vector<COutPoint,_std::allocator<COutPoint>_> *inputs,int input_height
          ,vector<CKey,_std::allocator<CKey>_> *input_signing_keys,
          vector<CTxOut,_std::allocator<CTxOut>_> *outputs,bool submit)

{
  long lVar1;
  ChainstateManager *this_00;
  long in_FS_OFFSET;
  undefined1 local_139;
  CTransactionRef local_138;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock27;
  MempoolAcceptResult result;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  criticalblock27.super_unique_lock._M_owns = false;
  local_138.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_5_ =
       (uint5)(uint)local_138.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr;
  CreateValidTransaction
            ((pair<CMutableTransaction,_long> *)&result,(TestChain100Setup *)&criticalblock27,
             input_transactions,inputs,input_height,input_signing_keys,outputs,
             (optional<CFeeRate> *)&criticalblock27,(optional<unsigned_int> *)&local_138);
  (__return_storage_ptr__->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)result._0_8_;
  (__return_storage_ptr__->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)result.m_state.super_ValidationState<TxValidationResult>._0_8_;
  (__return_storage_ptr__->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)result.m_state.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus
                ._M_p;
  result.m_state.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p =
       (pointer)0x0;
  result.m_result_type = VALID;
  result._4_4_ = 0;
  result.m_state.super_ValidationState<TxValidationResult>.m_mode = M_VALID;
  result.m_state.super_ValidationState<TxValidationResult>.m_result = TX_RESULT_UNSET;
  (__return_storage_ptr__->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)result.m_state.super_ValidationState<TxValidationResult>.m_reject_reason.
                _M_string_length;
  (__return_storage_ptr__->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)result.m_state.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
                _M_allocated_capacity;
  (__return_storage_ptr__->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)result.m_state.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
                _8_8_;
  result.m_state.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._8_8_ = 0;
  result.m_state.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length = 0;
  result.m_state.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
  _M_allocated_capacity = 0;
  *(pointer *)&__return_storage_ptr__->version =
       result.m_state.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p;
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)
             &result.m_state.super_ValidationState<TxValidationResult>.m_reject_reason.
              _M_string_length);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)&result);
  if (submit) {
    criticalblock27.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
    criticalblock27.super_unique_lock._M_owns = false;
    std::unique_lock<std::recursive_mutex>::lock(&criticalblock27.super_unique_lock);
    this_00 = (this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.m_node.
              chainman._M_t.
              super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t
              .super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
              super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl;
    local_138.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction&>
              (&local_138.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(CTransaction **)&local_138,(allocator<CTransaction> *)&local_139,
               __return_storage_ptr__);
    ChainstateManager::ProcessTransaction(&result,this_00,&local_138,false);
    if (local_138.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_138.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (result.m_result_type != VALID) {
      __assert_fail("result.m_result_type == MempoolAcceptResult::ResultType::VALID",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util/setup_common.cpp"
                    ,0x1f2,
                    "CMutableTransaction TestChain100Setup::CreateValidMempoolTransaction(const std::vector<CTransactionRef> &, const std::vector<COutPoint> &, int, const std::vector<CKey> &, const std::vector<CTxOut> &, bool)"
                   );
    }
    if (result.m_wtxids_fee_calculations.
        super__Optional_base<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
        ._M_engaged == true) {
      result.m_wtxids_fee_calculations.
      super__Optional_base<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
      ._M_engaged = false;
      if (result.m_wtxids_fee_calculations.
          super__Optional_base<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
          ._M_payload._M_value.
          super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(result.m_wtxids_fee_calculations.
                        super__Optional_base<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
                        ._M_payload._M_value.
                        super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)result.m_wtxids_fee_calculations.
                              super__Optional_base<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
                              ._M_payload._M_value.
                              super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        result.m_wtxids_fee_calculations.
                        super__Optional_base<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
                        ._M_payload._0_8_);
      }
    }
    std::__cxx11::
    _List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::_M_clear(&result.m_replaced_transactions.
                super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)result.m_state.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p
        != &result.m_state.super_ValidationState<TxValidationResult>.m_debug_message.field_2) {
      operator_delete(result.m_state.super_ValidationState<TxValidationResult>.m_debug_message.
                      _M_dataplus._M_p,
                      result.m_state.super_ValidationState<TxValidationResult>.m_debug_message.
                      field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)result.m_state.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p
        != &result.m_state.super_ValidationState<TxValidationResult>.m_reject_reason.field_2) {
      operator_delete(result.m_state.super_ValidationState<TxValidationResult>.m_reject_reason.
                      _M_dataplus._M_p,
                      result.m_state.super_ValidationState<TxValidationResult>.m_reject_reason.
                      field_2._M_allocated_capacity + 1);
    }
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock27.super_unique_lock);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

CMutableTransaction TestChain100Setup::CreateValidMempoolTransaction(const std::vector<CTransactionRef>& input_transactions,
                                                                     const std::vector<COutPoint>& inputs,
                                                                     int input_height,
                                                                     const std::vector<CKey>& input_signing_keys,
                                                                     const std::vector<CTxOut>& outputs,
                                                                     bool submit)
{
    CMutableTransaction mempool_txn = CreateValidTransaction(input_transactions, inputs, input_height, input_signing_keys, outputs, std::nullopt, std::nullopt).first;
    // If submit=true, add transaction to the mempool.
    if (submit) {
        LOCK(cs_main);
        const MempoolAcceptResult result = m_node.chainman->ProcessTransaction(MakeTransactionRef(mempool_txn));
        assert(result.m_result_type == MempoolAcceptResult::ResultType::VALID);
    }
    return mempool_txn;
}